

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

void __thiscall chrono::turtlebot::Turtlebot_Part::AddCollisionShapes(Turtlebot_Part *this)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<chrono::collision::ChCollisionModel> local_188;
  ChMatrix33<double> local_178;
  shared_ptr<chrono::geometry::ChTriangleMesh> local_130;
  shared_ptr<chrono::ChMaterialSurface> local_120;
  shared_ptr<chrono::collision::ChCollisionModel> local_110;
  shared_ptr<chrono::collision::ChCollisionModel> local_100;
  ChMatrix33<double> local_f0;
  ChVector<double> local_a8;
  undefined1 local_90 [8];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  string local_30 [8];
  string vis_mesh_file;
  Turtlebot_Part *this_local;
  
  std::operator+((char *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "robot/turtlebot/");
  std::operator+(local_50,(char *)local_70);
  chrono::GetChronoDataFile(local_30);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_70);
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)local_90,SUB81(local_30,0),false);
  peVar1 = std::
           __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
  ChVector<double>::ChVector(&local_a8,&this->m_offset);
  ChMatrix33<double>::ChMatrix33(&local_f0,1.0);
  (**(code **)(*(long *)peVar1 + 0x80))(peVar1,&local_a8,&local_f0);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->m_body);
  ChBody::GetCollisionModel((ChBody *)&local_100);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_100);
  (**(code **)(*(long *)peVar2 + 0x18))();
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_100);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->m_body);
  ChBody::GetCollisionModel((ChBody *)&local_110);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_110);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_120,&this->m_mat);
  std::shared_ptr<chrono::geometry::ChTriangleMesh>::
  shared_ptr<chrono::geometry::ChTriangleMeshConnected,void>
            (&local_130,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_90);
  ChMatrix33<double>::ChMatrix33(&local_178,1.0);
  (**(code **)(*(long *)peVar2 + 0x80))
            (0x3f747ae147ae147b,peVar2,&local_120,&local_130,0,0,&VNULL,&local_178);
  std::shared_ptr<chrono::geometry::ChTriangleMesh>::~shared_ptr(&local_130);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_120);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_110);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->m_body);
  ChBody::GetCollisionModel((ChBody *)&local_188);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_188);
  (**(code **)(*(long *)peVar2 + 0x20))();
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_188);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
  chrono::ChBody::SetCollide(SUB81(peVar3,0));
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr
            ((shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_90);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Turtlebot_Part::AddCollisionShapes() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, false, false);
    trimesh->Transform(m_offset, ChMatrix33<>(1));

    m_body->GetCollisionModel()->ClearModel();
    m_body->GetCollisionModel()->AddTriangleMesh(m_mat, trimesh, false, false, VNULL, ChMatrix33<>(1), 0.005);
    m_body->GetCollisionModel()->BuildModel();
    m_body->SetCollide(m_collide);
}